

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_color_argb(int count,QT_FT_Span *spans,void *userData)

{
  QRgb x;
  uint uVar1;
  uint a;
  uint uVar2;
  int priority;
  uchar *puVar3;
  anon_class_32_4_8e14794e *paVar4;
  ulong uVar5;
  long *in_RDX;
  int *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  int cn;
  int i_1;
  int c_1;
  QThreadPool *threadPool;
  int segments;
  CompositionFunctionSolid funcSolid;
  int i;
  int ialpha;
  uint c;
  uint *target;
  uint color;
  QSpanData *data;
  QSemaphore semaphore;
  Operator op;
  anon_class_32_4_8e14794e function;
  undefined8 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  int iVar6;
  int in_stack_fffffffffffffeac;
  int iVar7;
  QColor *in_stack_fffffffffffffeb0;
  anon_class_32_4_8e14794e *this;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int iVar8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  uint uVar9;
  int *local_108;
  int local_fc;
  undefined1 *local_e0;
  int local_d8 [8];
  code *local_b8;
  code *local_18;
  QRgb local_10;
  undefined4 uStack_c;
  long local_8;
  
  iVar8 = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_d8,&DAT_00bfe220,0xb0);
  getOperator((QSpanData *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
              (QT_FT_Span *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),iVar8);
  x = QColor::rgba(in_stack_fffffffffffffeb0);
  local_108 = in_RSI;
  local_fc = in_EDI;
  if (local_d8[0] == 3) {
    while (local_fc != 0) {
      puVar3 = QRasterBuffer::scanLine((QRasterBuffer *)*in_RDX,local_108[2]);
      puVar3 = puVar3 + (long)*local_108 * 4;
      if ((char)local_108[3] == -1) {
        qt_memfill<unsigned_int>
                  ((quint32 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   (quint32)((ulong)in_stack_fffffffffffffe98 >> 0x20),0xb45160);
      }
      else if (local_108[1] < 0x11) {
        uVar1 = BYTE_MUL(x,(uint)*(byte *)(local_108 + 3));
        a = 0xff - *(byte *)(local_108 + 3);
        for (iVar8 = 0; iVar8 < local_108[1]; iVar8 = iVar8 + 1) {
          uVar9 = uVar1;
          uVar2 = BYTE_MUL(*(uint *)(puVar3 + (long)iVar8 * 4),a);
          *(uint *)(puVar3 + (long)iVar8 * 4) = uVar1 + uVar2;
          in_stack_fffffffffffffea0 = uVar1;
          uVar1 = uVar9;
        }
      }
      else {
        (*local_b8)(puVar3,local_108[1],x,(char)local_108[3]);
      }
      local_108 = local_108 + 4;
      local_fc = local_fc + -1;
    }
  }
  else {
    local_18 = local_b8;
    _local_10 = CONCAT44(0xaaaaaaaa,x);
    iVar8 = (in_EDI + 0x20) / 0x40;
    paVar4 = (anon_class_32_4_8e14794e *)QGuiApplicationPrivate::qtGuiThreadPool();
    this = paVar4;
    if (((1 < iVar8) && (2 < (int)qPixelLayouts[*(uint *)(*in_RDX + 0x10)].bpp)) &&
       (paVar4 != (anon_class_32_4_8e14794e *)0x0)) {
      QThread::currentThread();
      uVar5 = QThreadPool::contains((QThread *)paVar4);
      if ((uVar5 & 1) == 0) {
        local_e0 = &DAT_aaaaaaaaaaaaaaaa;
        QSemaphore::QSemaphore((QSemaphore *)&local_e0,0);
        iVar7 = 0;
        for (iVar6 = 0; iVar6 < iVar8; iVar6 = iVar6 + 1) {
          priority = (in_EDI - iVar7) / (iVar8 - iVar6);
          QThreadPool::
          start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4058:5),_true>
                    ((QThreadPool *)this,(anon_class_24_4_b418dff8_for_o *)CONCAT44(iVar7,iVar6),
                     priority);
          iVar7 = priority + iVar7;
        }
        QSemaphore::acquire((int)&local_e0);
        QSemaphore::~QSemaphore((QSemaphore *)&local_e0);
        goto LAB_00b45405;
      }
    }
    blend_color_argb::anon_class_32_4_8e14794e::operator()
              (this,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  }
LAB_00b45405:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void blend_color_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, nullptr, 0);
    const uint color = data->solidColor.rgba();

    if (op.mode == QPainter::CompositionMode_Source) {
        // inline for performance
        while (count--) {
            uint *target = ((uint *)data->rasterBuffer->scanLine(spans->y)) + spans->x;
            if (spans->coverage == 255) {
                qt_memfill(target, color, spans->len);
#ifdef __SSE2__
            } else if (spans->len > 16) {
                op.funcSolid(target, spans->len, color, spans->coverage);
#endif
            } else {
                uint c = BYTE_MUL(color, spans->coverage);
                int ialpha = 255 - spans->coverage;
                for (int i = 0; i < spans->len; ++i)
                    target[i] = c + BYTE_MUL(target[i], ialpha);
            }
            ++spans;
        }
        return;
    }
    const auto funcSolid = op.funcSolid;
    auto function = [=] (int cStart, int cEnd) {
        for (int c = cStart; c < cEnd; ++c) {
            uint *target = ((uint *)data->rasterBuffer->scanLine(spans[c].y)) + spans[c].x;
            funcSolid(target, spans[c].len, color, spans[c].coverage);
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}